

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O2

void Min_EsopMinimize(Min_Man_t *p)

{
  Min_Cube_t **ppMVar1;
  int iVar2;
  Min_Cube_t *pMVar3;
  sbyte sVar4;
  sbyte sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  Min_Cube_t *pMVar9;
  Min_Cube_t *pCube1;
  int iVar10;
  Min_Cube_t *pMVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int local_78;
  int Var0;
  long local_70;
  int local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  
  iVar2 = p->nCubes;
  if (iVar2 < 3) {
    return;
  }
  pMVar3 = p->pBubble;
LAB_00342ecd:
  ppMVar1 = p->ppStore;
  pMVar3->pNext = *ppMVar1;
  *ppMVar1 = pMVar3;
  *(uint *)&pMVar3->field_0x8 = *(uint *)&pMVar3->field_0x8 & 0x3fffff;
  local_64 = iVar2;
LAB_00342ee5:
  do {
    pMVar3 = p->pBubble;
    uVar12 = *(uint *)&pMVar3->field_0x8 >> 0x16;
    uVar14 = (ulong)uVar12;
    pMVar9 = (Min_Cube_t *)((ulong)(uVar12 * 8) + (long)p->ppStore);
    do {
      pMVar11 = pMVar9;
      pMVar9 = pMVar11->pNext;
      if (pMVar9 == (Min_Cube_t *)0x0) break;
    } while (pMVar9 != pMVar3);
    if (pMVar9 != pMVar3) {
      __assert_fail("pCube == p->pBubble",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covMinEsop.c"
                    ,0x65,"void Min_EsopRewrite(Min_Man_t *)");
    }
    pMVar11->pNext = pMVar3->pNext;
    pMVar3 = p->pBubble;
    pMVar9 = pMVar3->pNext;
    pCube1 = pMVar9;
    if (pMVar9 == (Min_Cube_t *)0x0) {
      uVar8 = (ulong)(uVar12 * 8);
      do {
        if ((long)p->nVars <= (long)uVar14) {
          iVar2 = p->nCubes;
          if (((double)(local_64 - iVar2) * 100.0) / (double)local_64 <= 3.0) {
            return;
          }
          goto LAB_00342ecd;
        }
        uVar14 = uVar14 + 1;
        pMVar9 = *(Min_Cube_t **)((long)p->ppStore + uVar8 + 8);
        uVar8 = uVar8 + 8;
      } while (pMVar9 == (Min_Cube_t *)0x0);
      pMVar11 = (Min_Cube_t *)((long)p->ppStore + uVar8);
      pCube1 = pMVar9;
    }
    do {
      pMVar3 = pCube1;
      pCube1 = pMVar3->pNext;
      if (pCube1 == (Min_Cube_t *)0x0) {
        iVar2 = p->nVars;
        iVar13 = (int)uVar14;
        lVar6 = (long)iVar13;
        if (iVar2 <= iVar13) goto LAB_00342fc6;
        pCube1 = (Min_Cube_t *)(p->ppStore + lVar6 + 1);
        local_70 = lVar6;
        goto LAB_00342f9a;
      }
      iVar2 = Min_CubesDistTwo(pMVar9,pCube1,&Var0,&local_78);
    } while (iVar2 == 0);
LAB_00343004:
    pMVar3->pNext = pCube1->pNext;
    pMVar3 = p->pBubble;
    pMVar11->pNext = pMVar3;
    pMVar3->pNext = pMVar9->pNext;
    *(uint *)&pMVar3->field_0x8 =
         *(uint *)&pMVar3->field_0x8 & 0x3fffff | *(uint *)&pMVar9->field_0x8 & 0xffc00000;
    p->nCubes = p->nCubes + -2;
    local_70 = (long)(Var0 >> 4);
    local_3c = Var0 * 2 & 0x1e;
    sVar4 = (sbyte)local_3c;
    local_38 = (long)(local_78 >> 4);
    local_4c = local_78 * 2 & 0x1e;
    sVar5 = (sbyte)local_4c;
    local_40 = pMVar9->uData[local_70] >> sVar4 & 3;
    local_48 = pMVar9->uData[local_38] >> sVar5 & 3;
    local_44 = pCube1->uData[local_70] >> sVar4 & 3;
    uVar12 = pCube1->uData[local_38] >> sVar5 & 3;
    local_5c = local_44 << sVar4;
    pMVar9->uData[local_70] = pMVar9->uData[local_70] ^ local_5c;
    local_60 = local_44 ^ local_40;
    local_50 = (uint)(local_60 != 3) * 0x400000;
    local_54 = local_48 << sVar5;
    *(uint *)&pMVar9->field_0x8 =
         *(uint *)&pMVar9->field_0x8 & 0x3fffff |
         ((uint)(local_40 == 3) * 0x400000 + *(uint *)&pMVar9->field_0x8 + local_50) - 0x400000 &
         0xffc00000;
    pCube1->uData[local_38] = pCube1->uData[local_38] ^ local_54;
    local_58 = (uint)((uVar12 ^ local_48) != 3);
    iVar10 = local_58 * 0x400000;
    *(uint *)&pCube1->field_0x8 =
         (uint)(uVar12 == 3) * 0x400000 + iVar10 + *(int *)&pCube1->field_0x8 + -0x400000;
    iVar2 = p->nCubes;
    Min_EsopAddCube(p,pMVar9);
    Min_EsopAddCube(p,pCube1);
    iVar13 = p->nCubes;
    if (iVar2 + 2 <= iVar13) {
      uVar7 = *(uint *)&pCube1->field_0x8 >> 0x16;
      if (pCube1 != p->ppStore[uVar7]) {
        __assert_fail("pThis == p->ppStore[pThis->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covMinEsop.c"
                      ,0xb3,"void Min_EsopRewrite(Min_Man_t *)");
      }
      p->ppStore[uVar7] = pCube1->pNext;
      uVar7 = *(uint *)&pMVar9->field_0x8 >> 0x16;
      if (pMVar9 != p->ppStore[uVar7]) {
        __assert_fail("pCube == p->ppStore[pCube->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covMinEsop.c"
                      ,0xb5,"void Min_EsopRewrite(Min_Man_t *)");
      }
      p->ppStore[uVar7] = pMVar9->pNext;
      p->nCubes = iVar13 + -2;
      pMVar9->uData[local_70] = pMVar9->uData[local_70] ^ local_5c;
      *(uint *)&pMVar9->field_0x8 =
           *(int *)&pMVar9->field_0x8 +
           (uint)(local_40 != 3) * 0x400000 + (uint)(local_60 == 3) * 0x400000 + -0x400000;
      pMVar9->uData[local_38] = pMVar9->uData[local_38] ^ uVar12 << ((byte)local_4c & 0x1f);
      *(uint *)&pMVar9->field_0x8 =
           *(int *)&pMVar9->field_0x8 + iVar10 + (uint)(local_48 != 3) * -0x400000;
      pCube1->uData[local_70] = pCube1->uData[local_70] ^ local_40 << ((byte)local_3c & 0x1f);
      *(uint *)&pCube1->field_0x8 =
           *(int *)&pCube1->field_0x8 + local_50 + (uint)(local_44 != 3) * -0x400000;
      pCube1->uData[local_38] = pCube1->uData[local_38] ^ local_54;
      *(uint *)&pCube1->field_0x8 =
           *(int *)&pCube1->field_0x8 + (uint)(uVar12 != 3) * 0x400000 + local_58 * -0x400000;
      Min_EsopAddCube(p,pMVar9);
      Min_EsopAddCube(p,pCube1);
    }
  } while( true );
LAB_00342f9a:
  pMVar3 = pCube1;
  pCube1 = pMVar3->pNext;
  if (pCube1 != (Min_Cube_t *)0x0) goto code_r0x00342fa6;
  iVar2 = p->nVars;
  lVar6 = local_70;
LAB_00342fc6:
  if (iVar13 < iVar2 + -1) {
    pCube1 = (Min_Cube_t *)(p->ppStore + lVar6 + 2);
    do {
      pMVar3 = pCube1;
      pCube1 = pMVar3->pNext;
      if (pCube1 == (Min_Cube_t *)0x0) goto LAB_00343291;
      iVar2 = Min_CubesDistTwo(pMVar9,pCube1,&Var0,&local_78);
    } while (iVar2 == 0);
    goto LAB_00343004;
  }
LAB_00343291:
  pMVar3 = p->pBubble;
  pMVar3->pNext = pMVar9->pNext;
  pMVar9->pNext = pMVar3;
  *(uint *)&pMVar3->field_0x8 =
       *(uint *)&pMVar3->field_0x8 & 0x3fffff | *(uint *)&pMVar9->field_0x8 & 0xffc00000;
  goto LAB_00342ee5;
code_r0x00342fa6:
  iVar2 = Min_CubesDistTwo(pMVar9,pCube1,&Var0,&local_78);
  if (iVar2 != 0) goto LAB_00343004;
  goto LAB_00342f9a;
}

Assistant:

void Min_EsopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_EsopRewrite( p );
        nIter++;
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );

//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
}